

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O2

void caffe::UpgradeNetInput(NetParameter *net_param)

{
  RepeatedPtrField<caffe::LayerParameter> *this;
  int32 iVar1;
  LayerParameter *this_00;
  InputParameter *pIVar2;
  Type *value;
  BlobShape *this_01;
  Type *from;
  Type *this_02;
  Type *other;
  int i;
  int index;
  int j;
  uint index_00;
  int iVar3;
  BlobShape *shape;
  
  iVar3 = (net_param->input_shape_).super_RepeatedPtrFieldBase.current_size_;
  if ((0 < iVar3) || (0 < (net_param->input_dim_).current_size_)) {
    this = &net_param->layer_;
    this_00 = google::protobuf::RepeatedPtrField<caffe::LayerParameter>::Add(this);
    LayerParameter::set_name(this_00,"input");
    LayerParameter::set_type(this_00,"Input");
    pIVar2 = LayerParameter::mutable_input_param(this_00);
    for (index = 0; index < (net_param->input_).super_RepeatedPtrFieldBase.current_size_;
        index = index + 1) {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(net_param->input_).super_RepeatedPtrFieldBase,index);
      LayerParameter::add_top(this_00,value);
      this_01 = google::protobuf::RepeatedPtrField<caffe::BlobShape>::Add(&pIVar2->shape_);
      if (iVar3 < 1) {
        for (index_00 = index * 4; index_00 < index * 4 + 4U; index_00 = index_00 + 1) {
          iVar1 = NetParameter::input_dim(net_param,index_00);
          BlobShape::add_dim(this_01,(long)iVar1);
        }
      }
      else {
        from = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                         (&(net_param->input_shape_).super_RepeatedPtrFieldBase,index);
        BlobShape::CopyFrom(this_01,from);
      }
    }
    iVar3 = (net_param->layer_).super_RepeatedPtrFieldBase.current_size_;
    while (1 < iVar3) {
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (&this->super_RepeatedPtrFieldBase,iVar3 + -2);
      iVar3 = iVar3 + -1;
      other = google::protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                        (&this->super_RepeatedPtrFieldBase,iVar3);
      LayerParameter::Swap(this_02,other);
    }
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(net_param->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(net_param->input_shape_).super_RepeatedPtrFieldBase);
  (net_param->input_dim_).current_size_ = 0;
  return;
}

Assistant:

void UpgradeNetInput(NetParameter* net_param) {
  // Collect inputs and convert to Input layer definitions.
  // If the NetParameter holds an input alone, without shape/dim, then
  // it's a legacy caffemodel and simply stripping the input field is enough.
  bool has_shape = net_param->input_shape_size() > 0;
  bool has_dim = net_param->input_dim_size() > 0;
  if (has_shape || has_dim) {
    LayerParameter* layer_param = net_param->add_layer();
    layer_param->set_name("input");
    layer_param->set_type("Input");
    InputParameter* input_param = layer_param->mutable_input_param();
    // Convert input fields into a layer.
    for (int i = 0; i < net_param->input_size(); ++i) {
      layer_param->add_top(net_param->input(i));
      if (has_shape) {
        input_param->add_shape()->CopyFrom(net_param->input_shape(i));
      } else {
        // Turn legacy input dimensions into shape.
        BlobShape* shape = input_param->add_shape();
        int first_dim = i*4;
        int last_dim = first_dim + 4;
        for (int j = first_dim; j < last_dim; j++) {
          shape->add_dim(net_param->input_dim(j));
        }
      }
    }
    // Swap input layer to beginning of net to satisfy layer dependencies.
    for (int i = net_param->layer_size() - 1; i > 0; --i) {
      net_param->mutable_layer(i-1)->Swap(net_param->mutable_layer(i));
    }
  }
  // Clear inputs.
  net_param->clear_input();
  net_param->clear_input_shape();
  net_param->clear_input_dim();
}